

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<long,long_long,11>::
     MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *t,longlong *u,long *ret)

{
  undefined8 *in_RDX;
  int64_t tmp;
  int64_t u1;
  int64_t t1;
  int64_t *in_stack_ffffffffffffffc8;
  undefined8 uVar1;
  
  uVar1 = 0;
  LargeIntRegMultiply<long,long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((int64_t *)0x0,in_stack_ffffffffffffffc8,(int64_t *)0x20f3ba);
  *in_RDX = uVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow( const T& t, const U& u, T& ret ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isInt64 && safeint_internal::int_traits<U>::isInt64, "T, U must be Int64");
        std::int64_t t1 = t;
        std::int64_t u1 = u;
        std::int64_t tmp = 0;
        LargeIntRegMultiply< std::int64_t, std::int64_t >::template RegMultiplyThrow< E >( t1, u1, &tmp);
        ret = tmp;
    }